

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parse
          (CollationRuleParser *this,UnicodeString *ruleString,CollationSettings *outSettings,
          UParseError *outParseError,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  UParseError *outParseError_local;
  CollationSettings *outSettings_local;
  UnicodeString *ruleString_local;
  CollationRuleParser *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this->settings = outSettings;
    this->parseError = outParseError;
    if (this->parseError != (UParseError *)0x0) {
      this->parseError->line = 0;
      this->parseError->offset = -1;
      this->parseError->preContext[0] = L'\0';
      this->parseError->postContext[0] = L'\0';
    }
    this->errorReason = (char *)0x0;
    parse(this,ruleString,errorCode);
  }
  return;
}

Assistant:

void
CollationRuleParser::parse(const UnicodeString &ruleString,
                           CollationSettings &outSettings,
                           UParseError *outParseError,
                           UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    settings = &outSettings;
    parseError = outParseError;
    if(parseError != NULL) {
        parseError->line = 0;
        parseError->offset = -1;
        parseError->preContext[0] = 0;
        parseError->postContext[0] = 0;
    }
    errorReason = NULL;
    parse(ruleString, errorCode);
}